

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cc
# Opt level: O2

void xLearn::check_double(DMatrix *matrix,bool has_label,bool has_field)

{
  pointer expected;
  vector<xLearn::Node,_std::allocator<xLearn::Node>_> *pvVar1;
  undefined7 in_register_00000031;
  char *pcVar2;
  uint *expected_00;
  ulong uVar3;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  AssertHelper local_60;
  int n;
  undefined4 local_50;
  int col_len;
  DMatrix *local_48;
  index_t *local_40;
  ulong local_38;
  
  local_50 = (undefined4)CONCAT71(in_register_00000031,has_label);
  local_40 = &matrix->row_length;
  local_68.ptr_._0_4_ = 200000;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&gtest_ar,"matrix.row_length","2*kNum_lines",local_40,(uint *)&local_68);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_68);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
               ,0x55,pcVar2);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  uVar3 = 0;
  local_48 = matrix;
  do {
    if (*local_40 <= uVar3) {
      return;
    }
    if ((char)local_50 == '\0') {
      local_68.ptr_._0_4_ = 0xfffffffe;
      testing::internal::CmpHelperEQ<float,int>
                ((internal *)&gtest_ar,"matrix.Y[i]","-2",
                 (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar3,(int *)&local_68);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_68);
        pcVar2 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                   ,0x5b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        goto LAB_00124d6b;
      }
    }
    else {
      local_68.ptr_._0_4_ = 1;
      testing::internal::CmpHelperEQ<float,int>
                ((internal *)&gtest_ar,"matrix.Y[i]","1",
                 (matrix->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar3,(int *)&local_68);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_68);
        pcVar2 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                   ,0x59,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
LAB_00124d6b:
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_68);
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)&gtest_ar,"matrix.norm[i]","13.888889",
               (matrix->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3],13.888889);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_68);
      pcVar2 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                 ,0x5d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_68);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    pvVar1 = (matrix->row).
             super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar3];
    local_68.ptr_._0_4_ = 5;
    col_len = (int)(((long)*(pointer *)
                            ((long)&(pvVar1->
                                    super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)
                                    ._M_impl.super__Vector_impl_data + 8) -
                    *(long *)&(pvVar1->
                              super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>).
                              _M_impl.super__Vector_impl_data) / 0xc);
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&gtest_ar,"col_len","5",&col_len,(int *)&local_68);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_68);
      pcVar2 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                 ,0x5f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_68);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    pvVar1 = (matrix->row).
             super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar3];
    n = 0;
    local_38 = uVar3;
    for (expected_00 = (uint *)(*(long *)&(pvVar1->
                                          super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>
                                          )._M_impl.super__Vector_impl_data + 4);
        expected = (pointer)(expected_00 + -1),
        expected !=
        *(pointer *)
         ((long)&(pvVar1->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
                 super__Vector_impl_data + 8); expected_00 = expected_00 + 3) {
      if (has_field) {
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  ((internal *)&gtest_ar,"iter->field_id","n",(uint *)expected,&n);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_68);
          pcVar2 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                     ,0x65,pcVar2);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
LAB_00124f94:
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr(&local_68);
        }
      }
      else {
        local_68.ptr_._0_4_ = 0;
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  ((internal *)&gtest_ar,"iter->field_id","0",(uint *)expected,(int *)&local_68);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&local_68);
          pcVar2 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                     ,0x67,pcVar2);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
          goto LAB_00124f94;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperEQ<unsigned_int,int>
                ((internal *)&gtest_ar,"iter->feat_id","n",expected_00,&n);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_68);
        pcVar2 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                   ,0x69,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_68);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)&gtest_ar,"iter->feat_val","0.12",(float)expected_00[1],0.12);
      if (gtest_ar.success_ == false) {
        testing::Message::Message((Message *)&local_68);
        pcVar2 = "";
        if (gtest_ar.message_.ptr_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                   ,0x6a,pcVar2);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        testing::internal::
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_68);
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&gtest_ar.message_);
      n = n + 1;
    }
    local_68.ptr_._0_4_ = 5;
    testing::internal::CmpHelperEQ<int,int>((internal *)&gtest_ar,"n","5",&n,(int *)&local_68);
    uVar3 = local_38;
    matrix = local_48;
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&local_68);
      pcVar2 = "";
      if (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/reader/parser_test.cc"
                 ,0x6d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_60);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(&local_68);
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&gtest_ar.message_);
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void check_double(const DMatrix& matrix, bool has_label, bool has_field) {
  EXPECT_EQ(matrix.row_length, 2*kNum_lines);
  // First check
  for (index_t i = 0; i < matrix.row_length; ++i) {
    if (has_label) {
      EXPECT_EQ(matrix.Y[i], 1);
    } else {
      EXPECT_EQ(matrix.Y[i], -2);
    }
    EXPECT_FLOAT_EQ(matrix.norm[i], 13.888889);
    int col_len = matrix.row[i]->size();
    EXPECT_EQ(col_len, 5);
    SparseRow *row = matrix.row[i];
    int n = 0;
    for (SparseRow::iterator iter = row->begin();
         iter != row->end(); ++iter) {
      if (has_field) {
        EXPECT_EQ(iter->field_id, n);
      } else {
        EXPECT_EQ(iter->field_id, 0);
      }
      EXPECT_EQ(iter->feat_id, n);
      EXPECT_FLOAT_EQ(iter->feat_val, 0.12);
      n++;
    }
    EXPECT_EQ(n, 5);
  }
}